

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

void __thiscall cppurses::Text_display::insert(Text_display *this,Glyph_string *text,size_t index)

{
  bool bVar1;
  size_type sVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
  local_a0;
  __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
  local_98;
  const_iterator local_90;
  Attribute local_81;
  const_iterator pvStack_80;
  Attribute a;
  const_iterator __end2;
  const_iterator __begin2;
  array<cppurses::Attribute,_8UL> *__range2;
  Glyph *glyph;
  iterator __end1;
  iterator __begin1;
  Glyph_string *__range1;
  Glyph_string local_38;
  size_t local_20;
  size_t index_local;
  Glyph_string *text_local;
  Text_display *this_local;
  
  local_20 = index;
  index_local = (size_t)text;
  text_local = (Glyph_string *)this;
  sVar2 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::size
                    (&(this->contents_).
                      super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
  if (index <= sVar2) {
    bVar1 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::empty
                      (&(this->contents_).
                        super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
    if (bVar1) {
      Glyph_string::Glyph_string(&local_38,text);
      append(this,&local_38);
      Glyph_string::~Glyph_string(&local_38);
    }
    else {
      __end1 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::begin
                         (&text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
      glyph = (Glyph *)std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::end
                                 (&text->
                                   super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
                                         *)&glyph), bVar1) {
        __range2 = (array<cppurses::Attribute,_8UL> *)
                   __gnu_cxx::
                   __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
                   ::operator*(&__end1);
        __begin2 = (const_iterator)&Attribute_list;
        __end2 = std::array<cppurses::Attribute,_8UL>::begin
                           ((array<cppurses::Attribute,_8UL> *)&Attribute_list);
        pvStack_80 = std::array<cppurses::Attribute,_8UL>::end
                               ((array<cppurses::Attribute,_8UL> *)&Attribute_list);
        for (; __end2 != pvStack_80; __end2 = __end2 + 1) {
          local_81 = *__end2;
          bVar1 = Brush::has_attribute(&this->insert_brush,local_81);
          if (bVar1) {
            Brush::add_attributes<cppurses::Attribute>((Brush *)(__range2 + 1),local_81);
          }
        }
        __gnu_cxx::
        __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
        ::operator++(&__end1);
      }
      local_a0._M_current = (Glyph *)std::begin<cppurses::Glyph_string>(&this->contents_);
      local_98 = __gnu_cxx::
                 __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
                 ::operator+(&local_a0,local_20);
      __gnu_cxx::
      __normal_iterator<cppurses::Glyph_const*,std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>>
      ::__normal_iterator<cppurses::Glyph*>
                ((__normal_iterator<cppurses::Glyph_const*,std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>>
                  *)&local_90,&local_98);
      __first = std::begin<cppurses::Glyph_string>(text);
      __last = std::end<cppurses::Glyph_string>(text);
      std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>::
      insert<__gnu_cxx::__normal_iterator<cppurses::Glyph*,std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>>,void>
                ((vector<cppurses::Glyph,std::allocator<cppurses::Glyph>> *)&this->contents_,
                 local_90,(__normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
                           )__first._M_current,
                 (__normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
                  )__last._M_current);
      (*(this->super_Widget)._vptr_Widget[3])();
      sig::
      Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
      ::operator()((Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                    *)&this->contents_modified,&this->contents_);
    }
  }
  return;
}

Assistant:

void Text_display::insert(Glyph_string text, std::size_t index) {
    if (index > contents_.size()) {
        return;
    }
    if (contents_.empty()) {
        this->append(std::move(text));
        return;
    }
    for (auto& glyph : text) {
        for (Attribute a : Attribute_list) {
            if (this->insert_brush.has_attribute(a)) {
                glyph.brush.add_attributes(a);
            }
        }
    }
    contents_.insert(std::begin(contents_) + index, std::begin(text),
                     std::end(text));
    this->update();
    contents_modified(contents_);
}